

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O1

ZoneState * QLocalTime::utcToLocal(ZoneState *__return_storage_ptr__,qint64 utcMillis)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  DaylightStatus DVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong utc;
  long in_FS_OFFSET;
  optional<long_long> oVar9;
  tm local;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (utcMillis < 0) {
    lVar3 = utcMillis + 1;
    lVar4 = -(lVar3 >> 0x3f);
    lVar7 = lVar3 / 1000 + (lVar3 >> 0x3f);
    utc = (lVar7 + lVar4) - 1;
    uVar8 = lVar3 + (lVar7 + lVar4) * -1000 + 999;
  }
  else {
    utc = (ulong)utcMillis / 1000;
    uVar8 = (ulong)utcMillis % 1000;
  }
  if (utc * 1000 + uVar8 != utcMillis) {
    __return_storage_ptr__->when = utcMillis;
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->dst = UnknownDaylightTime;
    __return_storage_ptr__->valid = false;
    goto LAB_0012736f;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = qLocalTime(utc,(tm *)&local_68);
  DVar5 = UnknownDaylightTime;
  if (bVar1) {
    oVar9 = QGregorianCalendar::julianFromParts
                      ((local_58._4_4_ - (uint)(local_58._4_4_ < -0x76b)) + 0x76c,(int)local_58 + 1,
                       uStack_60._4_4_);
    if (((undefined1  [16])
         oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_00127360;
    lVar4 = (long)(int)local_68 + ((long)local_68._4_4_ + (long)(int)uStack_60 * 0x3c) * 0x3c;
    lVar3 = oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload + -0x253d8c;
    lVar7 = lVar3 * 0x15180 + lVar4;
    if ((SEXT816(lVar3 * 0x15180) != SEXT816(lVar3) * SEXT416(0x15180)) ||
       (SCARRY8(lVar3 * 0x15180,lVar4))) goto LAB_00127360;
    iVar2 = 0;
    bVar1 = SEXT816(lVar7 * 1000) != SEXT816(lVar7) * SEXT416(1000);
    if (bVar1) goto LAB_00127360;
    bVar6 = false;
    if (!SCARRY8(lVar7 * 1000,uVar8)) {
      utcMillis = lVar7 * 1000 + uVar8;
      if (bVar1) {
        utcMillis = lVar7 * 1000;
      }
      DVar5 = (DaylightStatus)((int)local_48 != 0);
      iVar2 = (int)lVar7 - (int)utc;
      bVar6 = true;
    }
  }
  else {
LAB_00127360:
    iVar2 = 0;
    bVar6 = false;
  }
  __return_storage_ptr__->when = utcMillis;
  __return_storage_ptr__->offset = iVar2;
  __return_storage_ptr__->dst = DVar5;
  __return_storage_ptr__->valid = bVar6;
LAB_0012736f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState utcToLocal(qint64 utcMillis)
{
    const auto epoch = QRoundingDown::qDivMod<MSECS_PER_SEC>(utcMillis);
    const time_t epochSeconds = epoch.quotient;
    const int msec = epoch.remainder;
    Q_ASSERT(msec >= 0 && msec < MSECS_PER_SEC);
    if (qint64(epochSeconds) * MSECS_PER_SEC + msec != utcMillis) // time_t range too narrow
        return {utcMillis};

    tm local;
    if (!qLocalTime(epochSeconds, &local))
        return {utcMillis};

    auto jd = tmToJd(local);
    if (Q_UNLIKELY(!jd))
        return {utcMillis};

    const qint64 daySeconds = tmSecsWithinDay(local);
    Q_ASSERT(0 <= daySeconds && daySeconds < SECS_PER_DAY);
    qint64 localSeconds, localMillis;
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySeconds, &localSeconds)
                   || secondsAndMillisOverflow(localSeconds, qint64(msec), &localMillis))) {
        return {utcMillis};
    }
    const auto dst
        = local.tm_isdst ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;
    return { localMillis, int(localSeconds - epochSeconds), dst };
}